

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

size_t utf8cspn(void *src,void *reject)

{
  char *pcVar1;
  size_t sVar2;
  void *pvVar3;
  char cVar4;
  bool bVar5;
  
  if (*src == '\0') {
    return 0;
  }
  sVar2 = 0;
  do {
    if (*reject != '\0') {
      bVar5 = false;
      pvVar3 = reject;
      cVar4 = *reject;
      do {
        if (bVar5) {
          return sVar2;
        }
        bVar5 = cVar4 != *src;
        if (bVar5) {
          cVar4 = *(char *)((long)pvVar3 + 1);
        }
        else {
          cVar4 = *(char *)((long)pvVar3 + 1);
        }
        bVar5 = !bVar5;
        pvVar3 = (void *)((long)pvVar3 + 1);
      } while (cVar4 != '\0');
    }
    pcVar1 = (char *)((long)src + 1);
    src = (void *)((long)src + 1);
    sVar2 = sVar2 + 1;
  } while (*pcVar1 != '\0');
  return sVar2;
}

Assistant:

size_t utf8cspn(const void *src, const void *reject) {
  const char *s = (const char *)src;
  size_t chars = 0;

  while ('\0' != *s) {
    const char *r = (const char *)reject;
    size_t offset = 0;

    while ('\0' != *r) {
      // checking that if *r is the start of a utf8 codepoint
      // (it is not 0b10xxxxxx) and we have successfully matched
      // a previous character (0 < offset) - we found a match
      if ((0x80 != (0xc0 & *r)) && (0 < offset)) {
        return chars;
      } else {
        if (*r == s[offset]) {
          // part of a utf8 codepoint matched, so move our checking
          // onwards to the next byte
          offset++;
          r++;
        } else {
          // r could be in the middle of an unmatching utf8 code point,
          // so we need to march it on to the next character beginning,

          do {
            r++;
          } while (0x80 == (0xc0 & *r));

          // reset offset too as we found a mismatch
          offset = 0;
        }
      }
    }

    // the current utf8 codepoint in src did not match reject, but src
    // could have been partway through a utf8 codepoint, so we need to
    // march it onto the next utf8 codepoint starting byte
    do {
      s++;
    } while ((0x80 == (0xc0 & *s)));
    chars++;
  }

  return chars;
}